

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int IDASetPreconditioner(void *ida_mem,IDALsPrecSetupFn psetup,IDALsPrecSolveFn psolve)

{
  int iVar1;
  int line;
  char *msgfmt;
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDASetPreconditioner",&IDA_mem,&idals_mem);
  if (iVar1 == 0) {
    idals_mem->pset = psetup;
    idals_mem->psolve = psolve;
    if (idals_mem->LS->ops->setpreconditioner ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
      line = 0x1e9;
    }
    else {
      if (psetup != (IDALsPrecSetupFn)0x0) {
        psetup = idaLsPSetup;
      }
      if (psolve != (IDALsPrecSolveFn)0x0) {
        psolve = idaLsPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner(idals_mem->LS,IDA_mem,psetup,psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -9;
      line = 0x1f6;
    }
    IDAProcessError(IDA_mem,iVar1,line,"IDASetPreconditioner",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int IDASetPreconditioner(void* ida_mem, IDALsPrecSetupFn psetup,
                         IDALsPrecSolveFn psolve)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  SUNPSetupFn idals_psetup;
  SUNPSolveFn idals_psolve;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in IDALs interface */
  idals_mem->pset   = psetup;
  idals_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (idals_mem->LS->ops->setpreconditioner == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (IDALS_ILL_INPUT);
  }

  /* notify iterative linear solver to call IDALs interface routines */
  idals_psetup = (psetup == NULL) ? NULL : idaLsPSetup;
  idals_psolve = (psolve == NULL) ? NULL : idaLsPSolve;
  retval = SUNLinSolSetPreconditioner(idals_mem->LS, IDA_mem, idals_psetup,
                                      idals_psolve);
  if (retval != SUN_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (IDALS_SUNLS_FAIL);
  }

  return (IDALS_SUCCESS);
}